

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

bool __thiscall
duckdb_re2::Regexp::ParseState::ParseCCCharacter
          (ParseState *this,StringPiece *s,Rune *rp,StringPiece *whole_class,RegexpStatus *status)

{
  size_type sVar1;
  bool bVar2;
  int iVar3;
  
  if (s->size_ == 0) {
    status->code_ = kRegexpMissingBracket;
    sVar1 = whole_class->size_;
    (status->error_arg_).data_ = whole_class->data_;
    (status->error_arg_).size_ = sVar1;
    return false;
  }
  if (*s->data_ == '\\') {
    bVar2 = ParseEscape(s,rp,status,this->rune_max_);
    return bVar2;
  }
  iVar3 = StringPieceToRune(rp,s,status);
  return -1 < iVar3;
}

Assistant:

const_reference operator[](size_type i) const { return data_[i]; }